

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Disk * pbrt::Disk::Create(Transform *renderFromObject,Transform *objectFromRender,
                         bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,
                         Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  string local_60;
  Float local_40;
  Float local_3c;
  Float local_38;
  Float local_34;
  Disk *pDVar6;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"height","");
  local_34 = ParameterDictionary::GetOneFloat(parameters,&local_60,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"radius","");
  local_38 = ParameterDictionary::GetOneFloat(parameters,&local_60,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"innerradius","");
  local_3c = ParameterDictionary::GetOneFloat(parameters,&local_60,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"phimax","");
  local_40 = ParameterDictionary::GetOneFloat(parameters,&local_60,360.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
  pDVar6 = (Disk *)CONCAT44(extraout_var,iVar5);
  pDVar6->renderFromObject = renderFromObject;
  pDVar6->objectFromRender = objectFromRender;
  pDVar6->reverseOrientation = reverseOrientation;
  bVar4 = Transform::SwapsHandedness(renderFromObject);
  pDVar6->transformSwapsHandedness = bVar4;
  pDVar6->height = local_34;
  pDVar6->radius = local_38;
  pDVar6->innerRadius = local_3c;
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)local_40));
  uVar3 = vcmpss_avx512f(ZEXT416((uint)local_40),ZEXT816(0) << 0x40,1);
  pDVar6->phiMax = (Float)((uint)!(bool)((byte)uVar3 & 1) * (int)(auVar2._0_4_ * 0.017453292));
  return pDVar6;
}

Assistant:

Disk *Disk::Create(const Transform *renderFromObject, const Transform *objectFromRender,
                   bool reverseOrientation, const ParameterDictionary &parameters,
                   const FileLoc *loc, Allocator alloc) {
    Float height = parameters.GetOneFloat("height", 0.);
    Float radius = parameters.GetOneFloat("radius", 1);
    Float innerRadius = parameters.GetOneFloat("innerradius", 0);
    Float phimax = parameters.GetOneFloat("phimax", 360);
    return alloc.new_object<Disk>(renderFromObject, objectFromRender, reverseOrientation,
                                  height, radius, innerRadius, phimax);
}